

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

BOOL __thiscall
Js::SmallSpanSequence::GetRangeAt
          (SmallSpanSequence *this,int index,SmallSpanSequenceIter *iter,int *pCountOfMissed,
          StatementData *data)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if (this->pStatementBuffer->count <= (uint)index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x154f,"((uint32)index < pStatementBuffer->Count())",
                                "(uint32)index < pStatementBuffer->Count()");
    if (!bVar2) goto LAB_00776a51;
    *puVar3 = 0;
  }
  uVar6 = 0;
  if ((uint)index < this->pStatementBuffer->count) {
    uVar6 = this->pStatementBuffer->buffer[(uint)index];
  }
  if ((uVar6 & 0xffff0000) == 0x7fff0000) {
    if (this->pActualOffsetList == (GrowingUint32HeapArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1558,"(this->pActualOffsetList)","this->pActualOffsetList");
      if (!bVar2) goto LAB_00776a51;
      *puVar3 = 0;
    }
    if (this->pActualOffsetList->count == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1559,"(this->pActualOffsetList->Count() > 0)",
                                  "this->pActualOffsetList->Count() > 0");
      if (!bVar2) goto LAB_00776a51;
      *puVar3 = 0;
    }
    if (this->pActualOffsetList->count <= (uint)iter->indexOfActualOffset) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x155a,
                                  "(this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset)"
                                  ,
                                  "this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset"
                                 );
      if (!bVar2) goto LAB_00776a51;
      *puVar3 = 0;
    }
    iVar5 = 1;
    uVar4 = 0;
    if ((uint)iter->indexOfActualOffset < this->pActualOffsetList->count) {
      uVar4 = this->pActualOffsetList->buffer[(uint)iter->indexOfActualOffset];
    }
  }
  else {
    uVar4 = ((int)uVar6 >> 0x10) + iter->accumulatedSourceBegin;
    iVar5 = 0;
  }
  data->sourceBegin = uVar4;
  if ((uVar6 & 0xffff) == 0x7fff) {
    if (this->pActualOffsetList == (GrowingUint32HeapArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1567,"(this->pActualOffsetList)","this->pActualOffsetList");
      if (!bVar2) goto LAB_00776a51;
      *puVar3 = 0;
    }
    if (this->pActualOffsetList->count == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1568,"(this->pActualOffsetList->Count() > 0)",
                                  "this->pActualOffsetList->Count() > 0");
      if (!bVar2) goto LAB_00776a51;
      *puVar3 = 0;
    }
    if (this->pActualOffsetList->count <= (uint)(iter->indexOfActualOffset + iVar5)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1569,
                                  "(this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed))"
                                  ,
                                  "this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed)"
                                 );
      if (!bVar2) {
LAB_00776a51:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    uVar4 = iter->indexOfActualOffset + iVar5;
    uVar6 = 0;
    if (uVar4 < this->pActualOffsetList->count) {
      uVar6 = this->pActualOffsetList->buffer[uVar4];
    }
    data->bytecodeBegin = uVar6;
    iVar5 = iVar5 + 1;
  }
  else {
    data->bytecodeBegin = (uVar6 & 0xffff) + iter->accumulatedBytecodeBegin;
  }
  if (pCountOfMissed != (int *)0x0) {
    *pCountOfMissed = iVar5;
  }
  return 1;
}

Assistant:

BOOL SmallSpanSequence::GetRangeAt(int index, SmallSpanSequenceIter &iter, int * pCountOfMissed, StatementData & data)
    {
        Assert((uint32)index < pStatementBuffer->Count());

        SmallSpan span(pStatementBuffer->ItemInBuffer((uint32)index));

        int countOfMissed = 0;

        if ((short)span.sourceBegin == SHRT_MAX)
        {
            // Look in ActualOffset store
            Assert(this->pActualOffsetList);
            Assert(this->pActualOffsetList->Count() > 0);
            Assert(this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset);

            data.sourceBegin = this->pActualOffsetList->ItemInBuffer((uint32)iter.indexOfActualOffset);
            countOfMissed++;
        }
        else
        {
            data.sourceBegin = iter.accumulatedSourceBegin + (short)span.sourceBegin;
        }

        if (span.bytecodeBegin == SHRT_MAX)
        {
            // Look in ActualOffset store
            Assert(this->pActualOffsetList);
            Assert(this->pActualOffsetList->Count() > 0);
            Assert(this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed));

            data.bytecodeBegin = this->pActualOffsetList->ItemInBuffer((uint32)iter.indexOfActualOffset + countOfMissed);
            countOfMissed++;
        }
        else
        {
            data.bytecodeBegin = iter.accumulatedBytecodeBegin + span.bytecodeBegin;
        }

        if (pCountOfMissed)
        {
            *pCountOfMissed = countOfMissed;
        }

        return TRUE;
    }